

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O0

void __thiscall HttpServer::OnConnection(HttpServer *this,Handle *handle,uint32_t err)

{
  HttpContext *this_00;
  element_type *peVar1;
  HttpContext *context;
  uint32_t err_local;
  Handle *handle_local;
  HttpServer *this_local;
  
  if (err == 0) {
    this_00 = (HttpContext *)operator_new(0x90);
    HttpContext::HttpContext(this_00);
    peVar1 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)handle);
    (*peVar1->_vptr_CNSocket[9])(peVar1,this_00);
  }
  return;
}

Assistant:

void HttpServer::OnConnection(cppnet::Handle handle, uint32_t err) {
    if (err == CEC_SUCCESS) {
        auto context = new HttpContext();
        handle->SetContext((void*)context);
    }
}